

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O2

int mbedtls_des_key_check_key_parity(uchar *key)

{
  byte *pbVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 == 8) {
      return 0;
    }
    pbVar1 = key + lVar2;
    lVar2 = lVar2 + 1;
  } while (*pbVar1 == odd_parity_table[*pbVar1 >> 1]);
  return 1;
}

Assistant:

int mbedtls_des_key_check_key_parity( const unsigned char key[MBEDTLS_DES_KEY_SIZE] )
{
    int i;

    for( i = 0; i < MBEDTLS_DES_KEY_SIZE; i++ )
        if( key[i] != odd_parity_table[key[i] / 2] )
            return( 1 );

    return( 0 );
}